

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O0

int __thiscall
glcts::GeometryShaderAdjacencyTests::init(GeometryShaderAdjacencyTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  AdjacencyTestData *pAVar1;
  reference ppAVar2;
  GeometryShaderAdjacency *pGVar3;
  Context *pCVar4;
  AdjacencyTestData *local_60;
  AdjacencyTestData *local_58;
  AdjacencyTestData *local_50;
  AdjacencyTestData *local_48;
  AdjacencyTestData *local_40;
  AdjacencyTestData *local_38;
  AdjacencyTestData *local_30 [3];
  AdjacencyTestData *local_18;
  GeometryShaderAdjacencyTests *local_10;
  GeometryShaderAdjacencyTests *this_local;
  
  local_10 = this;
  pAVar1 = (AdjacencyTestData *)operator_new(0x58);
  AdjacencyTestData::AdjacencyTestData(pAVar1);
  local_18 = pAVar1;
  std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>::push_back
            (&this->m_tests_data,&local_18);
  ppAVar2 = std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>::
            back(&this->m_tests_data);
  configureTestDataLines(this,*ppAVar2,true,false);
  pGVar3 = (GeometryShaderAdjacency *)operator_new(0x2f0);
  pCVar4 = TestCaseGroupBase::getContext(&this->super_TestCaseGroupBase);
  ppAVar2 = std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>::
            back(&this->m_tests_data);
  GeometryShaderAdjacency::GeometryShaderAdjacency
            (pGVar3,pCVar4,&(this->super_TestCaseGroupBase).m_extParams,
             "adjacency_non_indiced_lines","Test 2.1 non indiced",*ppAVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pGVar3);
  pAVar1 = (AdjacencyTestData *)operator_new(0x58);
  AdjacencyTestData::AdjacencyTestData(pAVar1);
  local_30[0] = pAVar1;
  std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>::push_back
            (&this->m_tests_data,local_30);
  ppAVar2 = std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>::
            back(&this->m_tests_data);
  configureTestDataLines(this,*ppAVar2,true,true);
  pGVar3 = (GeometryShaderAdjacency *)operator_new(0x2f0);
  pCVar4 = TestCaseGroupBase::getContext(&this->super_TestCaseGroupBase);
  ppAVar2 = std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>::
            back(&this->m_tests_data);
  GeometryShaderAdjacency::GeometryShaderAdjacency
            (pGVar3,pCVar4,&(this->super_TestCaseGroupBase).m_extParams,"adjacency_indiced_lines",
             "Test 2.1 indiced",*ppAVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pGVar3);
  pAVar1 = (AdjacencyTestData *)operator_new(0x58);
  AdjacencyTestData::AdjacencyTestData(pAVar1);
  local_38 = pAVar1;
  std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>::push_back
            (&this->m_tests_data,&local_38);
  ppAVar2 = std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>::
            back(&this->m_tests_data);
  configureTestDataLineStrip(this,*ppAVar2,true,false);
  pGVar3 = (GeometryShaderAdjacency *)operator_new(0x2f0);
  pCVar4 = TestCaseGroupBase::getContext(&this->super_TestCaseGroupBase);
  ppAVar2 = std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>::
            back(&this->m_tests_data);
  GeometryShaderAdjacency::GeometryShaderAdjacency
            (pGVar3,pCVar4,&(this->super_TestCaseGroupBase).m_extParams,
             "adjacency_non_indiced_line_strip","Test 2.3 non indiced",*ppAVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pGVar3);
  pAVar1 = (AdjacencyTestData *)operator_new(0x58);
  AdjacencyTestData::AdjacencyTestData(pAVar1);
  local_40 = pAVar1;
  std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>::push_back
            (&this->m_tests_data,&local_40);
  ppAVar2 = std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>::
            back(&this->m_tests_data);
  configureTestDataLineStrip(this,*ppAVar2,true,true);
  pGVar3 = (GeometryShaderAdjacency *)operator_new(0x2f0);
  pCVar4 = TestCaseGroupBase::getContext(&this->super_TestCaseGroupBase);
  ppAVar2 = std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>::
            back(&this->m_tests_data);
  GeometryShaderAdjacency::GeometryShaderAdjacency
            (pGVar3,pCVar4,&(this->super_TestCaseGroupBase).m_extParams,
             "adjacency_indiced_line_strip","Test 2.3 indiced",*ppAVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pGVar3);
  pAVar1 = (AdjacencyTestData *)operator_new(0x58);
  AdjacencyTestData::AdjacencyTestData(pAVar1);
  local_48 = pAVar1;
  std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>::push_back
            (&this->m_tests_data,&local_48);
  ppAVar2 = std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>::
            back(&this->m_tests_data);
  configureTestDataTriangles(this,*ppAVar2,true,false);
  pGVar3 = (GeometryShaderAdjacency *)operator_new(0x2f0);
  pCVar4 = TestCaseGroupBase::getContext(&this->super_TestCaseGroupBase);
  ppAVar2 = std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>::
            back(&this->m_tests_data);
  GeometryShaderAdjacency::GeometryShaderAdjacency
            (pGVar3,pCVar4,&(this->super_TestCaseGroupBase).m_extParams,
             "adjacency_non_indiced_triangles","Test 2.5 non indiced",*ppAVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pGVar3);
  pAVar1 = (AdjacencyTestData *)operator_new(0x58);
  AdjacencyTestData::AdjacencyTestData(pAVar1);
  local_50 = pAVar1;
  std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>::push_back
            (&this->m_tests_data,&local_50);
  ppAVar2 = std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>::
            back(&this->m_tests_data);
  configureTestDataTriangles(this,*ppAVar2,true,true);
  pGVar3 = (GeometryShaderAdjacency *)operator_new(0x2f0);
  pCVar4 = TestCaseGroupBase::getContext(&this->super_TestCaseGroupBase);
  ppAVar2 = std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>::
            back(&this->m_tests_data);
  GeometryShaderAdjacency::GeometryShaderAdjacency
            (pGVar3,pCVar4,&(this->super_TestCaseGroupBase).m_extParams,
             "adjacency_indiced_triangles","Test 2.5 indiced",*ppAVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pGVar3);
  pAVar1 = (AdjacencyTestData *)operator_new(0x58);
  AdjacencyTestData::AdjacencyTestData(pAVar1);
  local_58 = pAVar1;
  std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>::push_back
            (&this->m_tests_data,&local_58);
  ppAVar2 = std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>::
            back(&this->m_tests_data);
  configureTestDataTriangleStrip(this,*ppAVar2,true,false);
  pGVar3 = (GeometryShaderAdjacency *)operator_new(0x2f0);
  pCVar4 = TestCaseGroupBase::getContext(&this->super_TestCaseGroupBase);
  ppAVar2 = std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>::
            back(&this->m_tests_data);
  GeometryShaderAdjacency::GeometryShaderAdjacency
            (pGVar3,pCVar4,&(this->super_TestCaseGroupBase).m_extParams,
             "adjacency_non_indiced_triangle_strip","Test 2.7 non indiced",*ppAVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pGVar3);
  pAVar1 = (AdjacencyTestData *)operator_new(0x58);
  AdjacencyTestData::AdjacencyTestData(pAVar1);
  local_60 = pAVar1;
  std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>::push_back
            (&this->m_tests_data,&local_60);
  ppAVar2 = std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>::
            back(&this->m_tests_data);
  configureTestDataTriangleStrip(this,*ppAVar2,true,true);
  pGVar3 = (GeometryShaderAdjacency *)operator_new(0x2f0);
  pCVar4 = TestCaseGroupBase::getContext(&this->super_TestCaseGroupBase);
  ppAVar2 = std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>::
            back(&this->m_tests_data);
  GeometryShaderAdjacency::GeometryShaderAdjacency
            (pGVar3,pCVar4,&(this->super_TestCaseGroupBase).m_extParams,
             "adjacency_indiced_triangle_strip","Test 2.7 indiced",*ppAVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pGVar3);
  return extraout_EAX;
}

Assistant:

void GeometryShaderAdjacencyTests::init(void)
{
	/* Tests for GL_LINES_ADJACENCY_EXT */

	/* Test 2.1 Non indiced Data */
	m_tests_data.push_back(new AdjacencyTestData());
	configureTestDataLines(*m_tests_data.back(), true, false);
	addChild(new GeometryShaderAdjacency(getContext(), m_extParams, "adjacency_non_indiced_lines",
										 "Test 2.1 non indiced", *m_tests_data.back()));
	/* Test 2.1 indiced Data */
	m_tests_data.push_back(new AdjacencyTestData());
	configureTestDataLines(*m_tests_data.back(), true, true);
	addChild(new GeometryShaderAdjacency(getContext(), m_extParams, "adjacency_indiced_lines", "Test 2.1 indiced",
										 *m_tests_data.back()));

	/* Tests for GL_LINE_STRIP_ADJACENCY_EXT */

	/* Test 2.3 Non indiced Data */
	m_tests_data.push_back(new AdjacencyTestData());
	configureTestDataLineStrip(*m_tests_data.back(), true, false);
	addChild(new GeometryShaderAdjacency(getContext(), m_extParams, "adjacency_non_indiced_line_strip",
										 "Test 2.3 non indiced", *m_tests_data.back()));
	/* Test 2.3 indiced Data */
	m_tests_data.push_back(new AdjacencyTestData());
	configureTestDataLineStrip(*m_tests_data.back(), true, true);
	addChild(new GeometryShaderAdjacency(getContext(), m_extParams, "adjacency_indiced_line_strip", "Test 2.3 indiced",
										 *m_tests_data.back()));

	/* Tests for GL_TRIANGLES_ADJACENCY_EXT */

	/* Test 2.5 Non indiced Data */
	m_tests_data.push_back(new AdjacencyTestData());
	configureTestDataTriangles(*m_tests_data.back(), true, false);
	addChild(new GeometryShaderAdjacency(getContext(), m_extParams, "adjacency_non_indiced_triangles",
										 "Test 2.5 non indiced", *m_tests_data.back()));
	/* Test 2.5 indiced Data */
	m_tests_data.push_back(new AdjacencyTestData());
	configureTestDataTriangles(*m_tests_data.back(), true, true);
	addChild(new GeometryShaderAdjacency(getContext(), m_extParams, "adjacency_indiced_triangles", "Test 2.5 indiced",
										 *m_tests_data.back()));

	/* Tests for GL_TRIANGLE_STRIP_ADJACENCY_EXT */

	/* Test 2.7 Non indiced Data */
	m_tests_data.push_back(new AdjacencyTestData());
	configureTestDataTriangleStrip(*m_tests_data.back(), true, false);
	addChild(new GeometryShaderAdjacency(getContext(), m_extParams, "adjacency_non_indiced_triangle_strip",
										 "Test 2.7 non indiced", *m_tests_data.back()));
	/* Test 2.7 indiced Data */
	m_tests_data.push_back(new AdjacencyTestData());
	configureTestDataTriangleStrip(*m_tests_data.back(), true, true);
	addChild(new GeometryShaderAdjacency(getContext(), m_extParams, "adjacency_indiced_triangle_strip",
										 "Test 2.7 indiced", *m_tests_data.back()));
}